

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

Expression * __thiscall
soul::ResolutionPass::ConstantFolder::visit(ConstantFolder *this,UnaryOperator *o)

{
  pool_ref<soul::AST::Expression> *e;
  Expression *pEVar1;
  bool bVar2;
  Constant *pCVar3;
  Value *this_00;
  pool_ptr<soul::AST::Constant> constant;
  Value result;
  pool_ptr<soul::AST::Constant> local_b0;
  Value local_a8;
  Value local_68;
  
  e = &o->source;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  bVar2 = ErrorIgnoringRewritingASTVisitor::failIfNotResolved
                    (&this->super_ErrorIgnoringRewritingASTVisitor,&o->super_Expression);
  if ((!bVar2) &&
     ((*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_b0),
     local_b0.object != (Constant *)0x0)) {
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_b0);
    this_00 = &local_68;
    soul::Value::Value(this_00,&pCVar3->value);
    bVar2 = UnaryOp::apply(this_00,o->operation);
    if (bVar2) {
      pEVar1 = e->object;
      soul::Value::Value(&local_a8,&local_68);
      this_00 = (Value *)createConstant(this,&(pEVar1->super_Statement).super_ASTObject.context,
                                        &local_a8);
      soul::Value::~Value(&local_a8);
    }
    soul::Value::~Value(&local_68);
    if (bVar2) {
      return (Expression *)this_00;
    }
  }
  return &o->super_Expression;
}

Assistant:

AST::Expression& visit (AST::UnaryOperator& o) override
        {
            super::visit (o);

            if (failIfNotResolved (o))
                return o;

            if (auto constant = o.source->getAsConstant())
            {
                auto result = constant->value;

                if (UnaryOp::apply (result, o.operation))
                    return createConstant (o.source->context, std::move (result));
            }

            return o;
        }